

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bid_t filemgr_alloc_multiple_cond
                (filemgr *file,bid_t nextbid,int nblock,bid_t *begin,bid_t *end,
                err_log_callback *log_callback)

{
  uint64_t uVar1;
  ulong *in_RCX;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  long *in_R8;
  ssize_t rv;
  uint8_t _buf;
  bid_t bid;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  fdb_status in_stack_000001dc;
  err_log_callback *in_stack_000001e0;
  filemgr_ops *in_stack_000001e8;
  undefined4 in_stack_ffffffffffffffa8;
  memory_order in_stack_ffffffffffffffac;
  memory_order order;
  atomic<unsigned_long> *in_stack_ffffffffffffffb0;
  atomic<unsigned_long> *atomic_val;
  undefined1 local_39;
  ulong local_38;
  long *local_28;
  ulong *local_20;
  int local_14;
  ulong local_10;
  long local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  uVar1 = atomic_get_uint64_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_38 = uVar1 / *(uint *)(local_8 + 0x10);
  if (local_38 == local_10) {
    uVar1 = atomic_get_uint64_t(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *local_20 = uVar1 / *(uint *)(local_8 + 0x10);
    *local_28 = *local_20 + (long)local_14 + -1;
    atomic_add_uint64_t(in_stack_ffffffffffffffb0,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        memory_order_relaxed);
    if (global_config.ncacheblock < 1) {
      local_39 = 0;
      atomic_val = *(atomic<unsigned_long> **)(*(long *)(local_8 + 0xe8) + 8);
      order = *(memory_order *)(local_8 + 0x14);
      uVar1 = atomic_get_uint64_t(atomic_val,order);
      (*(code *)atomic_val)(order,&local_39,1,uVar1);
      _log_errno_str(in_stack_000001e8,in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,
                     in_stack_000001c8);
    }
  }
  else {
    *local_20 = 0xffffffffffffffff;
    *local_28 = -1;
  }
  pthread_spin_unlock((pthread_spinlock_t *)(local_8 + 0x1a0));
  return local_38;
}

Assistant:

bid_t filemgr_alloc_multiple_cond(struct filemgr *file, bid_t nextbid, int nblock,
                                  bid_t *begin, bid_t *end,
                                  err_log_callback *log_callback)
{
    bid_t bid;
    spin_lock(&file->lock);
    bid = atomic_get_uint64_t(&file->pos) / file->blocksize;
    if (bid == nextbid) {
        *begin = atomic_get_uint64_t(&file->pos) / file->blocksize;
        *end = *begin + nblock - 1;
        atomic_add_uint64_t(&file->pos, file->blocksize * nblock);

        if (global_config.ncacheblock <= 0) {
            // if block cache is turned off, write the allocated block before use
            uint8_t _buf = 0x0;
            ssize_t rv = file->ops->pwrite(file->fd, &_buf, 1,
                                           atomic_get_uint64_t(&file->pos));
            _log_errno_str(file->ops, log_callback, (fdb_status) rv, "WRITE", file->filename);
        }
    }else{
        *begin = BLK_NOT_FOUND;
        *end = BLK_NOT_FOUND;
    }
    spin_unlock(&file->lock);
    return bid;
}